

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::HasCMP0054AlreadyBeenReported(cmMakefile *this)

{
  byte bVar1;
  pair<std::_Rb_tree_const_iterator<cmListFileContext>,_bool> pVar2;
  cmListFileContext local_68;
  _Base_ptr local_20;
  byte local_18;
  cmMakefile *local_10;
  cmMakefile *this_local;
  
  local_10 = this;
  GetExecutionContext(&local_68,this);
  pVar2 = std::
          set<cmListFileContext,_std::less<cmListFileContext>,_std::allocator<cmListFileContext>_>::
          insert(&this->CMP0054ReportedIds,&local_68);
  local_20 = (_Base_ptr)pVar2.first._M_node;
  local_18 = pVar2.second;
  bVar1 = local_18 ^ 0xff;
  cmListFileContext::~cmListFileContext(&local_68);
  return (bool)(bVar1 & 1);
}

Assistant:

bool cmMakefile::HasCMP0054AlreadyBeenReported() const
{
  return !this->CMP0054ReportedIds.insert(this->GetExecutionContext()).second;
}